

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O2

void __thiscall
llvm::
DenseMapIterator<llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>,_false>
::AdvancePastEmptyBuckets
          (DenseMapIterator<llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>,_false>
           *this)

{
  pointer pvVar1;
  
  pvVar1 = this->Ptr;
  if (pvVar1 <= this->End) {
    while ((pvVar1 != this->End && (((ulong)pvVar1->key | 8) == 0xfffffffffffffff8))) {
      pvVar1 = pvVar1 + 1;
      this->Ptr = pvVar1;
    }
    return;
  }
  __assert_fail("Ptr <= End",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/DenseMap.h"
                ,0x4ad,
                "void llvm::DenseMapIterator<llbuild::core::CancellationDelegate *, llvm::detail::DenseSetEmpty, llvm::DenseMapInfo<llbuild::core::CancellationDelegate *>, llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate *>>::AdvancePastEmptyBuckets() [KeyT = llbuild::core::CancellationDelegate *, ValueT = llvm::detail::DenseSetEmpty, KeyInfoT = llvm::DenseMapInfo<llbuild::core::CancellationDelegate *>, Bucket = llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate *>, IsConst = false]"
               );
}

Assistant:

void AdvancePastEmptyBuckets() {
    assert(Ptr <= End);
    const KeyT Empty = KeyInfoT::getEmptyKey();
    const KeyT Tombstone = KeyInfoT::getTombstoneKey();

    while (Ptr != End && (KeyInfoT::isEqual(Ptr->getFirst(), Empty) ||
                          KeyInfoT::isEqual(Ptr->getFirst(), Tombstone)))
      ++Ptr;
  }